

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_fill_circle(nk_draw_list *list,nk_vec2 center,float radius,nk_color col,uint segs)

{
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x27b5,
                  "void nk_draw_list_fill_circle(struct nk_draw_list *, struct nk_vec2, float, struct nk_color, unsigned int)"
                 );
  }
  if ((uint)col < 0x1000000) {
    return;
  }
  nk_draw_list_path_arc_to
            (list,center,radius,0.0,(((float)segs + -1.0) * 6.2831855) / (float)segs,segs);
  nk_draw_list_path_fill(list,col);
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_circle(struct nk_draw_list *list, struct nk_vec2 center,
    float radius, struct nk_color col, unsigned int segs)
{
    float a_max;
    NK_ASSERT(list);
    if (!list || !col.a) return;
    a_max = NK_PI * 2.0f * ((float)segs - 1.0f) / (float)segs;
    nk_draw_list_path_arc_to(list, center, radius, 0.0f, a_max, segs);
    nk_draw_list_path_fill(list, col);
}